

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularStringView::GenerateAggregateInitializer
          (SingularStringView *this,Printer *p)

{
  Printer *pPVar1;
  bool bVar2;
  LogMessage *pLVar3;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  byte local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [23];
  Voidify local_19;
  Printer *local_18;
  Printer *p_local;
  SingularStringView *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar2 = FieldGeneratorBase::should_split(&this->super_FieldGeneratorBase);
  if (bVar2) {
    bVar2 = FieldGeneratorBase::is_inlined(&this->super_FieldGeneratorBase);
    local_41 = 0;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_40,"!is_inlined()");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/field_generators/string_view_field.cc"
                 ,0x212,local_40._M_len,local_40._M_str);
      local_41 = 1;
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar3);
    }
    pPVar1 = local_18;
    if ((local_41 & 1) != 0) {
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_58,"\n      decltype(Impl_::Split::$name$_){},\n    ");
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_58._M_len,local_58._M_str);
  }
  else {
    bVar2 = FieldGeneratorBase::is_inlined(&this->super_FieldGeneratorBase);
    pPVar1 = local_18;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_88,"\n      decltype($field_$){arena},\n    ");
      io::Printer::SourceLocation::current();
      io::Printer::Emit(pPVar1,local_88._M_len,local_88._M_str);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_70,"\n      decltype($field_$){},\n    ");
      io::Printer::SourceLocation::current();
      io::Printer::Emit(pPVar1,local_70._M_len,local_70._M_str);
    }
  }
  return;
}

Assistant:

void SingularStringView::GenerateAggregateInitializer(io::Printer* p) const {
  if (should_split()) {
    ABSL_CHECK(!is_inlined());
    p->Emit(R"cc(
      decltype(Impl_::Split::$name$_){},
    )cc");
  } else if (!is_inlined()) {
    p->Emit(R"cc(
      decltype($field_$){},
    )cc");
  } else {
    p->Emit(R"cc(
      decltype($field_$){arena},
    )cc");
  }
}